

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O3

int read_VXR(coda_cdf_product *product_file,coda_cdf_variable *variable,int64_t offset,int32_t first
            ,int32_t last)

{
  int64_t *piVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  ulong uVar23;
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [11];
  undefined1 auVar30 [15];
  undefined1 auVar31 [11];
  undefined1 auVar32 [12];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  int iVar48;
  int iVar49;
  int8_t *piVar50;
  Bytef *dst;
  bool bVar51;
  int *piVar52;
  ulong *dst_00;
  ulong uVar53;
  size_t __size;
  long lVar54;
  char *pcVar55;
  int32_t last_00;
  uint uVar56;
  ulong *puVar57;
  int iVar58;
  uint uVar59;
  long lVar60;
  uint uVar61;
  uInt uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int32_t record_type;
  int64_t csize;
  int local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  int local_e0;
  int local_dc;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  ulong local_b8;
  long local_b0;
  ulong local_a8;
  undefined1 local_a0 [80];
  voidpf local_50;
  undefined1 auVar67 [16];
  ulong uVar74;
  
  puVar57 = (ulong *)(ulong)(uint)last;
  if (offset == 0) {
    iVar49 = 0;
  }
  else {
    iVar48 = read_bytes(product_file->raw_product,offset + 8,4,&local_e0);
    iVar49 = -1;
    if (-1 < iVar48) {
      auVar63 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)local_e0 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_e0 >> 0x10),local_e0))
                                                  >> 0x20),local_e0) >> 0x18),
                                          (char)((uint)local_e0 >> 8)),(ushort)(byte)local_e0) &
                        0xffffff00ffffff);
      auVar63 = pshuflw(auVar63,auVar63,0x1b);
      sVar5 = auVar63._0_2_;
      sVar6 = auVar63._2_2_;
      sVar7 = auVar63._4_2_;
      sVar8 = auVar63._6_2_;
      local_e0 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar63[6] - (0xff < sVar8),
                          CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar63[4] - (0xff < sVar7),
                                   CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar63[2] -
                                            (0xff < sVar6),
                                            (0 < sVar5) * (sVar5 < 0x100) * auVar63[0] -
                                            (0xff < sVar5))));
      if (local_e0 == 6) {
        iVar48 = read_bytes(product_file->raw_product,offset + 0xc,8,&local_c8);
        if ((-1 < iVar48) &&
           (iVar48 = read_bytes(product_file->raw_product,offset + 0x14,4,&local_e8), -1 < iVar48))
        {
          piVar52 = &local_f0;
          iVar48 = read_bytes(product_file->raw_product,offset + 0x18,4,piVar52);
          last_00 = (int32_t)puVar57;
          iVar58 = (int)piVar52;
          if (-1 < iVar48) {
            auVar14._8_6_ = 0;
            auVar14._0_8_ = local_c8;
            auVar14[0xe] = (char)(local_c8 >> 0x38);
            auVar16._8_4_ = 0;
            auVar16._0_8_ = local_c8;
            auVar16[0xc] = (char)(local_c8 >> 0x30);
            auVar16._13_2_ = auVar14._13_2_;
            auVar18._8_4_ = 0;
            auVar18._0_8_ = local_c8;
            auVar18._12_3_ = auVar16._12_3_;
            auVar20._8_2_ = 0;
            auVar20._0_8_ = local_c8;
            auVar20[10] = (char)(local_c8 >> 0x28);
            auVar20._11_4_ = auVar18._11_4_;
            auVar22._8_2_ = 0;
            auVar22._0_8_ = local_c8;
            auVar22._10_5_ = auVar20._10_5_;
            auVar25[8] = (char)(local_c8 >> 0x20);
            auVar25._0_8_ = local_c8;
            auVar25._9_6_ = auVar22._9_6_;
            auVar63[7] = 0;
            auVar63._0_7_ = auVar25._8_7_;
            auVar28._7_8_ = 0;
            auVar28._0_7_ = auVar25._8_7_;
            auVar33._1_8_ = SUB158(auVar28 << 0x40,7);
            auVar33[0] = (char)(local_c8 >> 0x18);
            auVar33._9_6_ = 0;
            auVar29._1_10_ = SUB1510(auVar33 << 0x30,5);
            auVar29[0] = (char)(local_c8 >> 0x10);
            auVar34._11_4_ = 0;
            auVar34._0_11_ = auVar29;
            auVar27._3_12_ = SUB1512(auVar34 << 0x20,3);
            auVar27[2] = (char)(local_c8 >> 8);
            auVar27[1] = 0;
            auVar27[0] = (byte)local_c8;
            auVar63._8_4_ = auVar27._0_4_;
            auVar63._12_4_ = auVar29._0_4_;
            auVar63 = pshuflw(auVar63,auVar63,0x1b);
            auVar63 = pshufhw(auVar63,auVar63,0x1b);
            sVar5 = auVar63._0_2_;
            sVar6 = auVar63._2_2_;
            sVar7 = auVar63._4_2_;
            sVar8 = auVar63._6_2_;
            sVar9 = auVar63._8_2_;
            sVar10 = auVar63._10_2_;
            sVar11 = auVar63._12_2_;
            sVar12 = auVar63._14_2_;
            cVar2 = (0 < sVar12) * (sVar12 < 0x100) * auVar63[0xe] - (0xff < sVar12);
            local_c8 = CONCAT17(cVar2,CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar63[0xc] -
                                               (0xff < sVar11),
                                               CONCAT15((0 < sVar10) * (sVar10 < 0x100) *
                                                        auVar63[10] - (0xff < sVar10),
                                                        CONCAT14((0 < sVar9) * (sVar9 < 0x100) *
                                                                 auVar63[8] - (0xff < sVar9),
                                                                 CONCAT13((0 < sVar8) *
                                                                          (sVar8 < 0x100) *
                                                                          auVar63[6] -
                                                                          (0xff < sVar8),
                                                                          CONCAT12((0 < sVar7) *
                                                                                   (sVar7 < 0x100) *
                                                                                   auVar63[4] -
                                                                                   (0xff < sVar7),
                                                                                   CONCAT11((0 < 
                                                  sVar6) * (sVar6 < 0x100) * auVar63[2] -
                                                  (0xff < sVar6),
                                                  (0 < sVar5) * (sVar5 < 0x100) * auVar63[0] -
                                                  (0xff < sVar5))))))));
            auVar68._8_8_ = 0;
            auVar68._0_8_ =
                 (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(
                                                  byte)(local_e8 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_e8 >> 0x10),local_e8)) >>
                                                  0x20),local_e8) >> 0x18),
                                                 CONCAT12((char)(local_e8 >> 8),(short)local_e8)) >>
                                       0x10),(short)local_e8) & 0xffff00ff00ff00ff;
            auVar63 = pshuflw(auVar68,auVar68,0x1b);
            sVar5 = auVar63._0_2_;
            sVar6 = auVar63._2_2_;
            sVar7 = auVar63._4_2_;
            sVar8 = auVar63._6_2_;
            cVar3 = (0 < sVar8) * (sVar8 < 0x100) * auVar63[6] - (0xff < sVar8);
            local_e8 = CONCAT13(cVar3,CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar63[4] -
                                               (0xff < sVar7),
                                               CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar63[2] -
                                                        (0xff < sVar6),
                                                        (0 < sVar5) * (sVar5 < 0x100) * auVar63[0] -
                                                        (0xff < sVar5))));
            auVar78._8_8_ = 0;
            auVar78._0_8_ =
                 (ulong)CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)local_f0 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_f0 >> 0x10),local_f0))
                                                  >> 0x20),local_f0) >> 0x18),
                                          (char)((uint)local_f0 >> 8)),(ushort)(byte)local_f0) &
                 0xffff00ff00ffffff;
            auVar63 = pshuflw(auVar78,auVar78,0x1b);
            sVar5 = auVar63._0_2_;
            sVar6 = auVar63._2_2_;
            sVar7 = auVar63._4_2_;
            sVar8 = auVar63._6_2_;
            iVar48 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar63[6] - (0xff < sVar8),
                              CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar63[4] - (0xff < sVar7),
                                       CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar63[2] -
                                                (0xff < sVar6),
                                                (0 < sVar5) * (sVar5 < 0x100) * auVar63[0] -
                                                (0xff < sVar5))));
            local_f0 = iVar48;
            if ((cVar2 < '\0') || (product_file->file_size <= (long)local_c8)) {
              pcVar55 = "CDF file has invalid offset for VXR record";
            }
            else {
              local_a8 = (ulong)local_e8;
              if (-1 < cVar3) {
                if (0 < iVar48) {
                  lVar60 = offset + 0x1c;
                  lVar54 = 0;
                  do {
                    iVar49 = read_bytes(product_file->raw_product,lVar60 + lVar54 * 4,4,&local_e4);
                    if (iVar49 < 0) {
                      return -1;
                    }
                    iVar58 = (int)local_a8 + (int)lVar54;
                    iVar49 = read_bytes(product_file->raw_product,iVar58 * 4 + lVar60,4,&local_ec);
                    if (iVar49 < 0) {
                      return -1;
                    }
                    dst_00 = &local_d0;
                    iVar49 = read_bytes(product_file->raw_product,iVar58 * 8 + lVar60,8,dst_00);
                    if (iVar49 < 0) {
                      return -1;
                    }
                    local_d8 = CONCAT44(local_d8._4_4_,iVar48);
                    auVar63 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((
                                                  uint7)(byte)(local_e4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_e4 >> 0x10),local_e4)) >>
                                                  0x20),local_e4) >> 0x18),(char)(local_e4 >> 8)),
                                               (ushort)(byte)local_e4) & 0xffffff00ffffff);
                    auVar63 = pshuflw(auVar63,auVar63,0x1b);
                    sVar5 = auVar63._0_2_;
                    sVar6 = auVar63._2_2_;
                    sVar7 = auVar63._4_2_;
                    sVar8 = auVar63._6_2_;
                    cVar2 = (0 < sVar8) * (sVar8 < 0x100) * auVar63[6] - (0xff < sVar8);
                    uVar61 = CONCAT13(cVar2,CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar63[4] -
                                                     (0xff < sVar7),
                                                     CONCAT11((0 < sVar6) * (sVar6 < 0x100) *
                                                              auVar63[2] - (0xff < sVar6),
                                                              (0 < sVar5) * (sVar5 < 0x100) *
                                                              auVar63[0] - (0xff < sVar5))));
                    uVar23 = (ulong)uVar61;
                    auVar64._8_8_ = 0;
                    auVar64._0_8_ =
                         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((
                                                  uint7)(byte)(local_ec >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_ec >> 0x10),local_ec)) >>
                                                  0x20),local_ec) >> 0x18),
                                                  CONCAT12((char)(local_ec >> 8),(short)local_ec))
                                               >> 0x10),(short)local_ec) & 0xffff00ff00ff00ff;
                    auVar63 = pshuflw(auVar64,auVar64,0x1b);
                    sVar5 = auVar63._0_2_;
                    sVar6 = auVar63._2_2_;
                    sVar7 = auVar63._4_2_;
                    sVar8 = auVar63._6_2_;
                    cVar3 = (0 < sVar8) * (sVar8 < 0x100) * auVar63[6] - (0xff < sVar8);
                    uVar56 = CONCAT13(cVar3,CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar63[4] -
                                                     (0xff < sVar7),
                                                     CONCAT11((0 < sVar6) * (sVar6 < 0x100) *
                                                              auVar63[2] - (0xff < sVar6),
                                                              (0 < sVar5) * (sVar5 < 0x100) *
                                                              auVar63[0] - (0xff < sVar5))));
                    auVar13._8_6_ = 0;
                    auVar13._0_8_ = local_d0;
                    auVar13[0xe] = (char)(local_d0 >> 0x38);
                    auVar15._8_4_ = 0;
                    auVar15._0_8_ = local_d0;
                    auVar15[0xc] = (char)(local_d0 >> 0x30);
                    auVar15._13_2_ = auVar13._13_2_;
                    auVar17._8_4_ = 0;
                    auVar17._0_8_ = local_d0;
                    auVar17._12_3_ = auVar15._12_3_;
                    auVar19._8_2_ = 0;
                    auVar19._0_8_ = local_d0;
                    auVar19[10] = (char)(local_d0 >> 0x28);
                    auVar19._11_4_ = auVar17._11_4_;
                    auVar21._8_2_ = 0;
                    auVar21._0_8_ = local_d0;
                    auVar21._10_5_ = auVar19._10_5_;
                    auVar24[8] = (char)(local_d0 >> 0x20);
                    auVar24._0_8_ = local_d0;
                    auVar24._9_6_ = auVar21._9_6_;
                    auVar65[7] = 0;
                    auVar65._0_7_ = auVar24._8_7_;
                    auVar30._7_8_ = 0;
                    auVar30._0_7_ = auVar24._8_7_;
                    auVar35._1_8_ = SUB158(auVar30 << 0x40,7);
                    auVar35[0] = (char)(local_d0 >> 0x18);
                    auVar35._9_6_ = 0;
                    auVar31._1_10_ = SUB1510(auVar35 << 0x30,5);
                    auVar31[0] = (char)(local_d0 >> 0x10);
                    auVar36._11_4_ = 0;
                    auVar36._0_11_ = auVar31;
                    auVar26._3_12_ = SUB1512(auVar36 << 0x20,3);
                    auVar26[2] = (char)(local_d0 >> 8);
                    auVar26[1] = 0;
                    auVar26[0] = (byte)local_d0;
                    auVar65._8_4_ = auVar26._0_4_;
                    auVar65._12_4_ = auVar31._0_4_;
                    auVar63 = pshuflw(auVar65,auVar65,0x1b);
                    auVar63 = pshufhw(auVar63,auVar63,0x1b);
                    sVar5 = auVar63._0_2_;
                    sVar6 = auVar63._2_2_;
                    sVar7 = auVar63._4_2_;
                    sVar8 = auVar63._6_2_;
                    sVar9 = auVar63._8_2_;
                    sVar10 = auVar63._10_2_;
                    sVar11 = auVar63._12_2_;
                    sVar12 = auVar63._14_2_;
                    cVar4 = (0 < sVar12) * (sVar12 < 0x100) * auVar63[0xe] - (0xff < sVar12);
                    uVar53 = CONCAT17(cVar4,CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar63[0xc]
                                                     - (0xff < sVar11),
                                                     CONCAT15((0 < sVar10) * (sVar10 < 0x100) *
                                                              auVar63[10] - (0xff < sVar10),
                                                              CONCAT14((0 < sVar9) * (sVar9 < 0x100)
                                                                       * auVar63[8] - (0xff < sVar9)
                                                                       ,CONCAT13((0 < sVar8) *
                                                                                 (sVar8 < 0x100) *
                                                                                 auVar63[6] -
                                                                                 (0xff < sVar8),
                                                                                 CONCAT12((0 < sVar7
                                                                                          ) * (sVar7
                                                                                              < 
                                                  0x100) * auVar63[4] - (0xff < sVar7),
                                                  CONCAT11((0 < sVar6) * (sVar6 < 0x100) *
                                                           auVar63[2] - (0xff < sVar6),
                                                           (0 < sVar5) * (sVar5 < 0x100) *
                                                           auVar63[0] - (0xff < sVar5))))))));
                    local_ec = uVar56;
                    local_e4 = uVar61;
                    local_d0 = uVar53;
                    if (cVar2 < '\0') {
                      pcVar55 = "CDF file has invalid first record number in VXR record";
LAB_001238a1:
                      coda_set_error(-300,pcVar55);
                      return -1;
                    }
                    if (cVar3 < '\0') {
                      pcVar55 = "CDF file has invalid last record number in VXR record";
                      goto LAB_001238a1;
                    }
                    local_c0 = lVar54;
                    if ((cVar4 < '\0') || (product_file->file_size <= (long)uVar53)) {
                      pcVar55 = "CDF file has invalid offset for VR record";
                      goto LAB_001238a1;
                    }
                    if (uVar53 == 0) {
LAB_001234dd:
                      iVar58 = (int)dst_00;
                      iVar48 = local_f0;
                    }
                    else {
                      piVar52 = &local_dc;
                      iVar49 = read_bytes(product_file->raw_product,uVar53 + 8,4,piVar52);
                      auVar63 = _DAT_001a0f70;
                      if (iVar49 < 0) {
                        return -1;
                      }
                      auVar39._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
                      auVar39[0] = (char)((uint)local_dc >> 0x18);
                      auVar39._10_6_ = 0;
                      auVar67._5_11_ = SUB1611(auVar39 << 0x30,5);
                      auVar67[4] = (char)((uint)local_dc >> 0x10);
                      auVar67._0_4_ = local_dc;
                      auVar38._12_4_ = 0;
                      auVar38._0_12_ = auVar67._4_12_;
                      auVar66._3_13_ = SUB1613(auVar38 << 0x20,3);
                      auVar66[2] = (char)((uint)local_dc >> 8);
                      auVar66[0] = (byte)local_dc;
                      auVar66[1] = 0;
                      auVar68 = pshuflw(auVar66,auVar66,0x1b);
                      sVar5 = auVar68._0_2_;
                      sVar6 = auVar68._2_2_;
                      sVar7 = auVar68._4_2_;
                      sVar8 = auVar68._6_2_;
                      local_dc = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar68[6] -
                                          (0xff < sVar8),
                                          CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar68[4] -
                                                   (0xff < sVar7),
                                                   CONCAT11((0 < sVar6) * (sVar6 < 0x100) *
                                                            auVar68[2] - (0xff < sVar6),
                                                            (0 < sVar5) * (sVar5 < 0x100) *
                                                            auVar68[0] - (0xff < sVar5))));
                      if (local_dc == 0xd) {
                        if (variable->has_compression == 0) {
                          iVar49 = -0x16;
                          pcVar55 = "unexpected CVVR record for uncompressed CDF variable";
LAB_001234f5:
                          coda_set_error(iVar49,pcVar55);
                        }
                        else {
                          uVar59 = variable->num_records;
                          iVar58 = 0;
                          if ((int)uVar59 <= (int)uVar61) goto LAB_00123501;
                          if (variable->data == (int8_t *)0x0) {
                            iVar49 = variable->num_values_per_record;
                            local_b0 = (long)variable->value_size;
                            piVar50 = (int8_t *)malloc(iVar49 * local_b0 * (long)(int)uVar59);
                            variable->data = piVar50;
                            if (piVar50 != (int8_t *)0x0) goto LAB_001233af;
                            __size = (long)iVar49 * (ulong)uVar59 * local_b0;
                            puVar57 = (ulong *)0x2c9;
                          }
                          else {
LAB_001233af:
                            iVar49 = read_bytes(product_file->raw_product,uVar53 + 0x10,8,&local_b8)
                            ;
                            iVar58 = -1;
                            if (iVar49 < 0) goto LAB_00123501;
                            auVar37._8_6_ = 0;
                            auVar37._0_8_ = local_b8;
                            auVar37[0xe] = (char)(local_b8 >> 0x38);
                            auVar43._8_4_ = 0;
                            auVar43._0_8_ = local_b8;
                            auVar43[0xc] = (char)(local_b8 >> 0x30);
                            auVar43._13_2_ = auVar37._13_2_;
                            auVar44._8_4_ = 0;
                            auVar44._0_8_ = local_b8;
                            auVar44._12_3_ = auVar43._12_3_;
                            auVar45._8_2_ = 0;
                            auVar45._0_8_ = local_b8;
                            auVar45[10] = (char)(local_b8 >> 0x28);
                            auVar45._11_4_ = auVar44._11_4_;
                            auVar46._8_2_ = 0;
                            auVar46._0_8_ = local_b8;
                            auVar46._10_5_ = auVar45._10_5_;
                            auVar47[8] = (char)(local_b8 >> 0x20);
                            auVar47._0_8_ = local_b8;
                            auVar47._9_6_ = auVar46._9_6_;
                            uVar74 = CONCAT17(0,auVar47._8_7_);
                            auVar42._8_8_ = 0;
                            auVar42._0_8_ = uVar74;
                            auVar41._1_9_ = SUB169(auVar42 << 0x40,7);
                            auVar41[0] = (char)(local_b8 >> 0x18);
                            auVar41._10_6_ = 0;
                            auVar32._1_11_ = SUB1611(auVar41 << 0x30,5);
                            auVar32[0] = (char)(local_b8 >> 0x10);
                            auVar40._12_4_ = 0;
                            auVar40._0_12_ = auVar32;
                            auVar70._3_13_ = SUB1613(auVar40 << 0x20,3);
                            auVar70[2] = (char)(local_b8 >> 8);
                            auVar70[0] = (byte)local_b8;
                            auVar70[1] = 0;
                            auVar71._8_4_ = auVar70._0_4_;
                            auVar71._0_8_ = uVar74;
                            auVar71._12_4_ = auVar32._0_4_;
                            auVar63 = pshuflw(auVar71,auVar71,0x1b);
                            auVar63 = pshufhw(auVar63,auVar63,0x1b);
                            sVar5 = auVar63._0_2_;
                            sVar6 = auVar63._2_2_;
                            sVar7 = auVar63._4_2_;
                            sVar8 = auVar63._6_2_;
                            uVar62 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar63[6] -
                                              (0xff < sVar8),
                                              CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar63[4] -
                                                       (0xff < sVar7),
                                                       CONCAT11((0 < sVar6) * (sVar6 < 0x100) *
                                                                auVar63[2] - (0xff < sVar6),
                                                                (0 < sVar5) * (sVar5 < 0x100) *
                                                                auVar63[0] - (0xff < sVar5))));
                            sVar5 = auVar63._8_2_;
                            sVar6 = auVar63._10_2_;
                            sVar7 = auVar63._12_2_;
                            sVar8 = auVar63._14_2_;
                            __size = CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar63[0xe] -
                                              (0xff < sVar8),
                                              CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar63[0xc]
                                                       - (0xff < sVar7),
                                                       CONCAT15((0 < sVar6) * (sVar6 < 0x100) *
                                                                auVar63[10] - (0xff < sVar6),
                                                                CONCAT14((0 < sVar5) *
                                                                         (sVar5 < 0x100) *
                                                                         auVar63[8] - (0xff < sVar5)
                                                                         ,uVar62))));
                            local_b8 = __size;
                            if ((long)__size < 0x14) {
                              iVar49 = -300;
                              pcVar55 = "invalid compressed data block for CDF variable";
                              goto LAB_001234f5;
                            }
                            dst = (Bytef *)malloc(__size);
                            if (dst != (Bytef *)0x0) {
                              iVar49 = read_bytes(product_file->raw_product,uVar53 + 0x18,__size,dst
                                                 );
                              if (-1 < iVar49) {
                                local_a0._0_8_ = (Bytef *)0x0;
                                local_a0._8_4_ = 0;
                                local_a0._48_8_ = (char *)0x0;
                                local_50 = (voidpf)0x0;
                                local_a0._64_16_ = (undefined1  [16])0x0;
                                iVar49 = coda_inflateInit2_((z_streamp)local_a0,0x1f,"1.3.1",0x70);
                                if (iVar49 == 0) {
                                  iVar49 = variable->num_records;
                                  uVar59 = iVar49 - 1;
                                  if ((int)uVar56 < iVar49) {
                                    uVar59 = uVar56;
                                  }
                                  iVar48 = variable->value_size * variable->num_values_per_record;
                                  local_a0._32_4_ = ((uVar59 - uVar61) + 1) * iVar48;
                                  uVar53 = (ulong)(uint)local_a0._32_4_;
                                  local_a0._24_8_ = variable->data + (int)(iVar48 * uVar61);
                                  local_a0._0_8_ = dst;
                                  local_a0._8_4_ = uVar62;
                                  iVar48 = coda_inflate((z_streamp)local_a0,4);
                                  if (iVar48 == -2) {
                                    __assert_fail("result != Z_STREAM_ERROR",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                                                  ,0x303,
                                                  "int read_VR(coda_cdf_product *, coda_cdf_variable *, int64_t, int32_t, int32_t)"
                                                 );
                                  }
                                  bVar51 = iVar49 <= (int)uVar56;
                                  if ((-1 < iVar48) || (bVar51 = bVar51 && iVar48 == -5, bVar51)) {
                                    dst_00 = (ulong *)CONCAT71((int7)(uVar53 >> 8),bVar51);
                                    free(dst);
                                    iVar49 = coda_inflateEnd((z_streamp)local_a0);
                                    auVar63 = _DAT_001a0f70;
                                    if (iVar49 == 0) {
                                      if ((int)uVar61 <= (int)uVar59) {
                                        piVar1 = variable->offset;
                                        uVar59 = uVar59 - uVar61;
                                        auVar73._4_4_ = 0;
                                        auVar73._0_4_ = uVar59;
                                        auVar73._8_4_ = uVar59;
                                        auVar73._12_4_ = 0;
                                        iVar48 = variable->num_values_per_record *
                                                 variable->value_size;
                                        uVar56 = iVar48 * 2;
                                        dst_00 = (ulong *)(ulong)uVar56;
                                        iVar49 = (uVar61 + 1) * iVar48;
                                        iVar48 = iVar48 * uVar61;
                                        auVar73 = auVar73 ^ _DAT_001a0f70;
                                        puVar57 = (ulong *)0x0;
                                        do {
                                          auVar77._8_4_ = (int)puVar57;
                                          auVar77._0_8_ = puVar57;
                                          auVar77._12_4_ = (int)((ulong)puVar57 >> 0x20);
                                          auVar68 = (auVar77 | _DAT_001a0f60) ^ auVar63;
                                          if ((bool)(~(auVar73._4_4_ < auVar68._4_4_ ||
                                                      auVar73._0_4_ < auVar68._0_4_ &&
                                                      auVar68._4_4_ == auVar73._4_4_) & 1)) {
                                            piVar1[uVar23 + (long)puVar57] = (long)iVar48;
                                          }
                                          if (((-(ushort)(auVar73._12_4_ < auVar68._12_4_ ||
                                                         auVar73._8_4_ < auVar68._8_4_ &&
                                                         auVar68._12_4_ == auVar73._12_4_) ^
                                               DAT_001a0f80._8_2_) & 1) != 0) {
                                            piVar1[(long)puVar57 + uVar23 + 1] = (long)iVar49;
                                          }
                                          puVar57 = (ulong *)((long)puVar57 + 2);
                                          iVar48 = iVar48 + uVar56;
                                          iVar49 = iVar49 + uVar56;
                                        } while ((ulong *)((ulong)uVar59 + 2 & 0xfffffffffffffffe)
                                                 != puVar57);
                                      }
                                      goto LAB_001234dd;
                                    }
                                    coda_set_error(-0x16,"zlib error");
                                    if ((char *)local_a0._48_8_ != (char *)0x0) {
                                      coda_add_error_message(" (%s)");
                                    }
                                    goto LAB_001234fc;
                                  }
                                  if (iVar48 == -4) {
                                    coda_set_error(-1,(char *)0x0);
                                  }
                                  else {
                                    if (iVar48 == -3) {
                                      pcVar55 = 
                                      "invalid or incomplete compressed data for CDF variable";
                                    }
                                    else {
                                      pcVar55 = "error during decompression of CDF variable";
                                    }
                                    coda_set_error(-0x16,pcVar55);
                                    if ((char *)local_a0._48_8_ != (char *)0x0) {
                                      coda_add_error_message(" (%s)");
                                    }
                                  }
                                  coda_inflateEnd((z_streamp)local_a0);
                                }
                                else {
                                  coda_set_error(-0x16,"could not intialize zip decompression");
                                  if ((char *)local_a0._48_8_ != (char *)0x0) {
                                    coda_add_error_message(" (%s)");
                                  }
                                }
                              }
                              free(dst);
                              goto LAB_001234fc;
                            }
                            puVar57 = (ulong *)0x2e0;
                          }
                          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                                         __size,
                                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                                        );
                        }
LAB_001234fc:
                        iVar58 = -1;
                      }
                      else {
                        if (local_dc == 7) {
                          iVar49 = variable->num_records;
                          dst_00 = (ulong *)(long)iVar49;
                          uVar59 = iVar49 - 1;
                          if ((int)uVar56 < iVar49) {
                            uVar59 = uVar56;
                          }
                          if (variable->has_compression == 0) {
                            if ((int)uVar61 <= (int)uVar59) {
                              piVar1 = variable->offset;
                              uVar59 = uVar59 - uVar61;
                              dst_00 = (ulong *)((ulong)uVar59 + 2 & 0xfffffffffffffffe);
                              auVar72._4_4_ = 0;
                              auVar72._0_4_ = uVar59;
                              auVar72._8_4_ = uVar59;
                              auVar72._12_4_ = 0;
                              iVar49 = variable->num_values_per_record * variable->value_size;
                              iVar48 = 0;
                              auVar72 = auVar72 ^ _DAT_001a0f70;
                              puVar57 = (ulong *)0x0;
                              do {
                                auVar76._8_4_ = (int)puVar57;
                                auVar76._0_8_ = puVar57;
                                auVar76._12_4_ = (int)((ulong)puVar57 >> 0x20);
                                auVar68 = (auVar76 | _DAT_001a0f60) ^ auVar63;
                                if ((bool)(~(auVar72._4_4_ < auVar68._4_4_ ||
                                            auVar72._0_4_ < auVar68._0_4_ &&
                                            auVar68._4_4_ == auVar72._4_4_) & 1)) {
                                  piVar1[uVar23 + (long)puVar57] = (long)iVar48 + uVar53 + 0xc;
                                }
                                if (((-(ushort)(auVar72._12_4_ < auVar68._12_4_ ||
                                               auVar72._8_4_ < auVar68._8_4_ &&
                                               auVar68._12_4_ == auVar72._12_4_) ^
                                     DAT_001a0f80._8_2_) & 1) != 0) {
                                  piVar1[(long)puVar57 + uVar23 + 1] =
                                       (long)(iVar49 + iVar48) + uVar53 + 0xc;
                                }
                                puVar57 = (ulong *)((long)puVar57 + 2);
                                iVar48 = iVar48 + iVar49 * 2;
                              } while (dst_00 != puVar57);
                            }
                          }
                          else {
                            piVar50 = variable->data;
                            iVar48 = variable->num_values_per_record;
                            iVar58 = variable->value_size;
                            if (piVar50 == (int8_t *)0x0) {
                              local_d8 = (ulong)uVar59;
                              piVar50 = (int8_t *)malloc((long)(iVar49 * iVar48 * iVar58));
                              uVar59 = (uint)local_d8;
                              variable->data = piVar50;
                              if (piVar50 == (int8_t *)0x0) {
                                coda_set_error(-1,
                                               "out of memory (could not allocate %lu bytes) (%s:%u)"
                                               ,(long)iVar48 * (long)dst_00 * (long)iVar58,
                                               "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                                               ,0x295);
                                return -1;
                              }
                            }
                            uVar56 = iVar48 * iVar58 * uVar61;
                            puVar57 = (ulong *)(ulong)uVar56;
                            dst_00 = (ulong *)(piVar50 + (int)uVar56);
                            iVar49 = read_bytes(product_file->raw_product,uVar53 + 0xc,
                                                (long)(int)(((uVar59 - uVar61) + 1) *
                                                           iVar48 * iVar58),dst_00);
                            auVar63 = _DAT_001a0f70;
                            if (iVar49 < 0) {
                              return -1;
                            }
                            if ((int)uVar61 <= (int)uVar59) {
                              piVar1 = variable->offset;
                              uVar59 = uVar59 - uVar61;
                              iVar48 = variable->num_values_per_record * variable->value_size;
                              auVar69._4_4_ = 0;
                              auVar69._0_4_ = uVar59;
                              auVar69._8_4_ = uVar59;
                              auVar69._12_4_ = 0;
                              uVar56 = iVar48 * 2;
                              dst_00 = (ulong *)(ulong)uVar56;
                              iVar49 = (uVar61 + 1) * iVar48;
                              iVar48 = iVar48 * uVar61;
                              puVar57 = (ulong *)0x0;
                              do {
                                auVar75._8_4_ = (int)puVar57;
                                auVar75._0_8_ = puVar57;
                                auVar75._12_4_ = (int)((ulong)puVar57 >> 0x20);
                                auVar78 = auVar69 ^ auVar63;
                                auVar68 = (auVar75 | _DAT_001a0f60) ^ auVar63;
                                if ((bool)(~(auVar68._4_4_ == auVar78._4_4_ &&
                                             auVar78._0_4_ < auVar68._0_4_ ||
                                            auVar78._4_4_ < auVar68._4_4_) & 1)) {
                                  piVar1[uVar23 + (long)puVar57] = (long)iVar48;
                                }
                                if (((-(ushort)(auVar78._12_4_ < auVar68._12_4_ ||
                                               auVar68._12_4_ == auVar78._12_4_ &&
                                               auVar78._8_4_ < auVar68._8_4_) ^ DAT_001a0f80._8_2_)
                                    & 1) != 0) {
                                  piVar1[(long)puVar57 + uVar23 + 1] = (long)iVar49;
                                }
                                puVar57 = (ulong *)((long)puVar57 + 2);
                                iVar48 = iVar48 + uVar56;
                                iVar49 = iVar49 + uVar56;
                              } while ((ulong *)((ulong)uVar59 + 2 & 0xfffffffffffffffe) != puVar57)
                              ;
                            }
                          }
                          goto LAB_001234dd;
                        }
                        if (local_dc != 6) {
                          coda_set_error(-300,"CDF file has invalid record type (%d) for VVR record"
                                        );
                          return -1;
                        }
                        iVar58 = read_VXR(product_file,variable,uVar53,(int32_t)piVar52,
                                          (int32_t)puVar57);
                      }
LAB_00123501:
                      iVar48 = (int)local_d8;
                      if (iVar58 != 0) {
                        return -1;
                      }
                    }
                    last_00 = (int32_t)puVar57;
                    lVar54 = local_c0 + 1;
                  } while (lVar54 < iVar48);
                }
                iVar49 = read_VXR(product_file,variable,local_c8,iVar58,last_00);
                return -(uint)(iVar49 != 0);
              }
              pcVar55 = "CDF file has invalid number of entries for VXR record";
            }
            coda_set_error(-300,pcVar55);
          }
        }
      }
      else {
        coda_set_error(-300,"CDF file has invalid record type (%d) for VXR record");
      }
    }
  }
  return iVar49;
}

Assistant:

static int read_VXR(coda_cdf_product *product_file, coda_cdf_variable *variable, int64_t offset, int32_t first,
                    int32_t last)
{
    int32_t record_type;
    int64_t vxr_next;
    int32_t n_entries;
    int32_t nused_entries;
    int i;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 6)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for VXR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &vxr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 4, &n_entries) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 24, 4, &nused_entries) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int64(&vxr_next);
    swap_int32(&n_entries);
    swap_int32(&nused_entries);
#endif
    offset += 28;
    if (vxr_next < 0 || vxr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VXR record");
        return -1;
    }
    if (n_entries < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of entries for VXR record");
        return -1;
    }

    for (i = 0; i < nused_entries; i++)
    {
        int32_t vr_first;
        int32_t vr_last;
        int64_t vr_offset;

        if (read_bytes(product_file->raw_product, offset + i * 4, 4, &vr_first) < 0)
        {
            return -1;
        }
        if (read_bytes(product_file->raw_product, offset + (i + n_entries) * 4, 4, &vr_last) < 0)
        {
            return -1;
        }
        if (read_bytes(product_file->raw_product, offset + (i + n_entries) * 8, 8, &vr_offset) < 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&vr_first);
        swap_int32(&vr_last);
        swap_int64(&vr_offset);
#endif
        if (vr_first < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid first record number in VXR record");
            return -1;
        }
        if (vr_last < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid last record number in VXR record");
            return -1;
        }
        if (vr_offset < 0 || vr_offset >= product_file->file_size)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VR record");
            return -1;
        }
        if (read_VR(product_file, variable, vr_offset, vr_first, vr_last) != 0)
        {
            return -1;
        }
    }

    if (read_VXR(product_file, variable, vxr_next, first, last) != 0)
    {
        return -1;
    }

    return 0;
}